

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

int __thiscall lzham::lzcompressor::init(lzcompressor *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  compression_level cVar3;
  task_pool *ptVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  raw_parse_thread_state *prVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  clear(this);
  if (*(int *)(ctx + 0x10) - 0x1eU < 0xfffffff1) {
    return 0;
  }
  if (5 < *(uint *)(ctx + 0xc)) {
    return 0;
  }
  uVar5 = *(undefined8 *)(ctx + 8);
  uVar6 = *(undefined8 *)(ctx + 0x10);
  uVar7 = *(undefined8 *)(ctx + 0x18);
  (this->m_params).m_pTask_pool = *(task_pool **)ctx;
  (this->m_params).m_max_helper_threads = (int)uVar5;
  (this->m_params).m_compression_level = (int)((ulong)uVar5 >> 0x20);
  (this->m_params).m_lzham_compress_flags = *(uint *)(ctx + 0x20);
  (this->m_params).m_dict_size_log2 = (int)uVar6;
  (this->m_params).m_block_size = (int)((ulong)uVar6 >> 0x20);
  (this->m_params).m_num_cachelines = (int)uVar7;
  (this->m_params).m_cacheline_size = (int)((ulong)uVar7 >> 0x20);
  ptVar4 = (this->m_params).m_pTask_pool;
  if ((ptVar4 == (task_pool *)0x0) || (ptVar4->m_num_threads == 0)) {
    bVar12 = false;
  }
  else {
    bVar12 = (this->m_params).m_max_helper_threads != 0;
  }
  this->m_use_task_pool = bVar12;
  if ((this->m_params).m_max_helper_threads != 0 && bVar12 == false) {
    return 0;
  }
  uVar5 = *(undefined8 *)(s_settings + (ulong)*(uint *)(ctx + 0xc) * 0x10);
  uVar6 = *(undefined8 *)(s_settings + (ulong)*(uint *)(ctx + 0xc) * 0x10 + 8);
  (this->m_settings).m_fast_bytes = (int)uVar5;
  (this->m_settings).m_fast_adaptive_huffman_updating = (bool)(char)((ulong)uVar5 >> 0x20);
  (this->m_settings).m_use_polar_codes = (bool)(char)((ulong)uVar5 >> 0x28);
  *(short *)&(this->m_settings).field_0x6 = (short)((ulong)uVar5 >> 0x30);
  (this->m_settings).m_match_accel_max_matches_per_probe = (int)uVar6;
  (this->m_settings).m_match_accel_max_probes = (int)((ulong)uVar6 >> 0x20);
  uVar1 = (this->m_params).m_lzham_compress_flags;
  if ((uVar1 & 1) != 0) {
    (this->m_settings).m_use_polar_codes = true;
  }
  uVar2 = (uint)(1 << ((byte)(this->m_params).m_dict_size_log2 & 0x1f)) >> 3;
  uVar10 = (this->m_params).m_block_size;
  if (uVar2 < uVar10) {
    (this->m_params).m_block_size = uVar2;
    uVar10 = uVar2;
  }
  this->m_num_parse_threads = 1;
  uVar2 = *(uint *)(ctx + 8);
  if (uVar2 != 0) {
    if (uVar10 < 0x4000) {
      uVar10 = 8;
      if (uVar2 + 1 < 8) {
        uVar10 = uVar2 + 1;
      }
    }
    else {
      if ((uVar2 == 1) ||
         (cVar3 = (this->m_params).m_compression_level, cVar3 == cCompressionLevelFastest))
      goto code_r0x0010d075;
      uVar10 = 2;
      if ((3 < uVar2) && (uVar10 = 4, uVar2 < 8)) {
        uVar10 = 2;
        if ((uVar1 & 2) != 0) {
          uVar10 = (uint)(cVar3 == cCompressionLevelUber) * 2 + 2;
        }
      }
    }
    this->m_num_parse_threads = uVar10;
  }
code_r0x0010d075:
  iVar9 = search_accelerator::init(&this->m_accel,(EVP_PKEY_CTX *)this);
  if ((char)iVar9 == '\0') {
    return 0;
  }
  CLZDecompBase::init_position_slots((CLZDecompBase *)this,*(uint *)(ctx + 0x10));
  CLZBase::init_slot_tabs(&this->super_CLZBase);
  iVar9 = state::init(&this->m_state,(EVP_PKEY_CTX *)this);
  if ((char)iVar9 == '\0') {
    return 0;
  }
  bVar12 = elemental_vector::increase_capacity
                     ((elemental_vector *)&this->m_block_buf,(this->m_params).m_block_size,true,1,
                      (object_mover)0x0,true);
  if (!bVar12) {
    return 0;
  }
  bVar12 = elemental_vector::increase_capacity
                     ((elemental_vector *)&this->m_comp_buf,(this->m_params).m_block_size * 2,true,1
                      ,(object_mover)0x0,true);
  if (bVar12) {
    if (this->m_num_parse_threads == 0) {
      return 1;
    }
    prVar8 = &this->m_parse_thread_state[0].super_raw_parse_thread_state;
    uVar11 = 0;
    do {
      iVar9 = state::init(&prVar8->m_approx_state,(EVP_PKEY_CTX *)this);
      if ((char)iVar9 == '\0') {
        return iVar9;
      }
      uVar11 = uVar11 + 1;
      prVar8 = (raw_parse_thread_state *)((long)(&prVar8->m_approx_state + 0x26) + 0x3e68);
    } while (uVar11 < this->m_num_parse_threads);
    return iVar9;
  }
  return 0;
}

Assistant:

bool lzcompressor::init(const init_params& params)
   {
      clear();

      if ((params.m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (params.m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
         return false;
      if ((params.m_compression_level < 0) || (params.m_compression_level > cCompressionLevelCount))
         return false;

      m_params = params;
      m_use_task_pool = (m_params.m_pTask_pool) && (m_params.m_pTask_pool->get_num_threads() != 0) && (m_params.m_max_helper_threads > 0);
      if ((m_params.m_max_helper_threads) && (!m_use_task_pool))
         return false;
      m_settings = s_settings[params.m_compression_level];

      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_POLAR_CODING)
         m_settings.m_use_polar_codes = true;

      const uint dict_size = 1U << m_params.m_dict_size_log2;

      uint max_block_size = dict_size / 8;
      if (m_params.m_block_size > max_block_size)
      {
         m_params.m_block_size = max_block_size;
      }

      m_num_parse_threads = 1;

#if !LZHAM_FORCE_SINGLE_THREADED_PARSING
      if (params.m_max_helper_threads > 0)
      {
         LZHAM_ASSUME(cMaxParseThreads >= 4);

         if (m_params.m_block_size < 16384)
         {
            m_num_parse_threads = LZHAM_MIN(cMaxParseThreads, params.m_max_helper_threads + 1);
         }
         else
         {
            if ((params.m_max_helper_threads == 1) || (m_params.m_compression_level == cCompressionLevelFastest))
            {
               m_num_parse_threads = 1;
            }
            else if (params.m_max_helper_threads <= 3)
            {
               m_num_parse_threads = 2;
            }
            else if (params.m_max_helper_threads <= 7)
            {
               if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) && (m_params.m_compression_level == cCompressionLevelUber))
                  m_num_parse_threads = 4;
               else
                  m_num_parse_threads = 2;
            }
            else
            {
               // 8-16
               m_num_parse_threads = 4;
            }
         }
      }
#endif

      int num_parse_jobs = m_num_parse_threads - 1;
      uint match_accel_helper_threads = LZHAM_MAX(0, (int)params.m_max_helper_threads - num_parse_jobs);

      LZHAM_ASSERT(m_num_parse_threads >= 1);
      LZHAM_ASSERT(m_num_parse_threads <= cMaxParseThreads);

      if (!m_use_task_pool)
      {
         LZHAM_ASSERT(!match_accel_helper_threads && (m_num_parse_threads == 1));
      }
      else
      {
         LZHAM_ASSERT((match_accel_helper_threads + (m_num_parse_threads - 1)) <= params.m_max_helper_threads);
      }

      if (!m_accel.init(this, params.m_pTask_pool, match_accel_helper_threads, dict_size, m_settings.m_match_accel_max_matches_per_probe, false, m_settings.m_match_accel_max_probes))
         return false;

      init_position_slots(params.m_dict_size_log2);
      init_slot_tabs();

      if (!m_state.init(*this, m_settings.m_fast_adaptive_huffman_updating, m_settings.m_use_polar_codes))
         return false;

      if (!m_block_buf.try_reserve(m_params.m_block_size))
         return false;

      if (!m_comp_buf.try_reserve(m_params.m_block_size*2))
         return false;

      for (uint i = 0; i < m_num_parse_threads; i++)
      {
         if (!m_parse_thread_state[i].m_approx_state.init(*this, m_settings.m_fast_adaptive_huffman_updating, m_settings.m_use_polar_codes))
            return false;
      }

      return true;
   }